

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O2

void testPosixIO(char *inFile,char *outFile,vector<char,_std::allocator<char>_> *inBuffer)

{
  int __fd;
  int __fd_00;
  ulong uVar1;
  ostream *poVar2;
  ulong __nbytes;
  size_t bytesLeft;
  
  __fd = open(inFile,0);
  if (__fd < 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open input file: ");
    outFile = inFile;
  }
  else {
    __fd_00 = open(outFile,0x41,0x1b6);
    if (-1 < __fd_00) {
      uVar1 = lseek(__fd,0,2);
      lseek(__fd,0,0);
      __nbytes = (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
      for (; uVar1 != 0; uVar1 = uVar1 - __nbytes) {
        if (uVar1 < __nbytes) {
          __nbytes = uVar1;
        }
        read(__fd,(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start,__nbytes);
        write(__fd_00,(inBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start,__nbytes);
      }
      close(__fd_00);
      close(__fd);
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open output file: ");
  }
  poVar2 = std::operator<<(poVar2,outFile);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void testPosixIO(const char* inFile, const char* outFile, std::vector<char>& inBuffer)
{
    int in = ::open(inFile, O_RDONLY | O_BINARY);
    if (in < 0)
    {
        std::cout << "Can't open input file: " << inFile << std::endl;
        return;
    }

    int out = ::open(outFile, O_CREAT | O_WRONLY | O_BINARY, 0666);
    if (out < 0)
    {
        std::cout << "Can't open output file: " << outFile << std::endl;
        return;
    }

    size_t inFileSize = ::lseek(in, 0, SEEK_END);
    ::lseek(in, 0, SEEK_SET);

    for (size_t bytesLeft = inFileSize, chunk = inBuffer.size(); bytesLeft > 0; bytesLeft -= chunk)
    {
        if (bytesLeft < chunk)
        {
            chunk = bytesLeft;
        }

        ::read(in, &inBuffer[0], chunk);
        ::write(out, &inBuffer[0], chunk);
    }

    ::close(out);
    ::close(in);
}